

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_check.cpp
# Opt level: O0

int CalendarFixture_param_date_check_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<CalendarFixture> *this_01;
  TestMetaFactoryBase<int> *meta_factory;
  allocator local_b1;
  string local_b0;
  CodeLocation local_90;
  allocator local_51;
  string local_50;
  CodeLocation local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/anastasiak2512[P]Calendar/calendars_tests/basic_tests/calendar_check.cpp"
             ,&local_51);
  testing::internal::CodeLocation::CodeLocation(&local_30,&local_50,0x41);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<CalendarFixture>(this_00,"CalendarFixture",&local_30);
  meta_factory = (TestMetaFactoryBase<int> *)operator_new(8);
  testing::internal::TestMetaFactory<CalendarFixture_param_date_check_Test>::TestMetaFactory
            ((TestMetaFactory<CalendarFixture_param_date_check_Test> *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/anastasiak2512[P]Calendar/calendars_tests/basic_tests/calendar_check.cpp"
             ,&local_b1);
  testing::internal::CodeLocation::CodeLocation(&local_90,&local_b0,0x41);
  testing::internal::ParameterizedTestSuiteInfo<CalendarFixture>::AddTestPattern
            (this_01,"CalendarFixture","param_date_check",meta_factory,&local_90);
  testing::internal::CodeLocation::~CodeLocation(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  testing::internal::CodeLocation::~CodeLocation(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

TEST_P(CalendarFixture, param_date_check) {
  int param = GetParam();

  sleep(2);
  int absolute = (*gregorian_calendar) + param;
  EXPECT_EQ(absolute, TEST_ABSOLUTE + param);
}